

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O1

zlib_table * zlib_mkonetab(int *codes,uchar *lengths,int nsyms,int pfx,int pfxbits,int bits)

{
  byte bVar1;
  zlib_table *pzVar2;
  zlib_tableentry *pzVar3;
  zlib_table *pzVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  int bits_00;
  long lVar9;
  long lVar10;
  
  bVar1 = (byte)bits;
  lVar9 = 0;
  pzVar2 = (zlib_table *)safemalloc(1,0x10,0);
  bVar5 = (byte)pfxbits;
  pzVar3 = (zlib_tableentry *)safemalloc(1L << (bVar1 & 0x3f),0x10,0);
  pzVar2->table = pzVar3;
  uVar7 = -1 << (bVar1 & 0x1f);
  uVar6 = ~uVar7;
  pzVar2->mask = uVar6;
  do {
    *(undefined2 *)((long)&pzVar3->code + lVar9) = 0xffff;
    (&pzVar3->nbits)[lVar9] = '\0';
    *(undefined8 *)((long)&pzVar3->nexttable + lVar9) = 0;
    lVar9 = lVar9 + 0x10;
  } while ((ulong)-uVar7 << 4 != lVar9);
  if (0 < nsyms) {
    uVar8 = 0;
    do {
      if ((pfxbits < (int)(uint)lengths[uVar8]) && ((codes[uVar8] & ~(-1 << (bVar5 & 0x1f))) == pfx)
         ) {
        uVar7 = codes[uVar8] >> (bVar5 & 0x1f) & uVar6;
        do {
          pzVar3[(int)uVar7].code = (short)uVar8;
          if ((int)(uint)pzVar3[(int)uVar7].nbits < (int)((uint)lengths[uVar8] - pfxbits)) {
            pzVar3[(int)uVar7].nbits = (uchar)((uint)lengths[uVar8] - pfxbits);
          }
          uVar7 = uVar7 + (1 << (lengths[uVar8] - bVar5 & 0x1f));
        } while ((int)uVar7 <= (int)uVar6);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)nsyms);
  }
  if (-1 < pzVar2->mask) {
    lVar10 = -1;
    lVar9 = 0;
    do {
      pzVar3 = pzVar2->table;
      bits_00 = (uint)(&pzVar3->nbits)[lVar9] - bits;
      if (bits_00 != 0 && bits <= (int)(uint)(&pzVar3->nbits)[lVar9]) {
        if (6 < bits_00) {
          bits_00 = 7;
        }
        *(undefined2 *)((long)&pzVar3->code + lVar9) = 0xffff;
        (&pzVar3->nbits)[lVar9] = bVar1;
        pzVar4 = zlib_mkonetab(codes,lengths,nsyms,(int)lVar10 + 1 << (bVar5 & 0x1f) | pfx,
                               bits + pfxbits,bits_00);
        *(zlib_table **)((long)&pzVar2->table->nexttable + lVar9) = pzVar4;
      }
      lVar10 = lVar10 + 1;
      lVar9 = lVar9 + 0x10;
    } while (lVar10 < pzVar2->mask);
  }
  return pzVar2;
}

Assistant:

static struct zlib_table *zlib_mkonetab(int *codes, unsigned char *lengths,
                                        int nsyms,
                                        int pfx, int pfxbits, int bits)
{
    struct zlib_table *tab = snew(struct zlib_table);
    int pfxmask = (1 << pfxbits) - 1;
    int nbits, i, j, code;

    tab->table = snewn((size_t)1 << bits, struct zlib_tableentry);
    tab->mask = (1 << bits) - 1;

    for (code = 0; code <= tab->mask; code++) {
        tab->table[code].code = -1;
        tab->table[code].nbits = 0;
        tab->table[code].nexttable = NULL;
    }

    for (i = 0; i < nsyms; i++) {
        if (lengths[i] <= pfxbits || (codes[i] & pfxmask) != pfx)
            continue;
        code = (codes[i] >> pfxbits) & tab->mask;
        for (j = code; j <= tab->mask; j += 1 << (lengths[i] - pfxbits)) {
            tab->table[j].code = i;
            nbits = lengths[i] - pfxbits;
            if (tab->table[j].nbits < nbits)
                tab->table[j].nbits = nbits;
        }
    }
    for (code = 0; code <= tab->mask; code++) {
        if (tab->table[code].nbits <= bits)
            continue;
        /* Generate a subtable. */
        tab->table[code].code = -1;
        nbits = tab->table[code].nbits - bits;
        if (nbits > 7)
            nbits = 7;
        tab->table[code].nbits = bits;
        tab->table[code].nexttable = zlib_mkonetab(codes, lengths, nsyms,
                                                   pfx | (code << pfxbits),
                                                   pfxbits + bits, nbits);
    }

    return tab;
}